

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sslexeme.cpp
# Opt level: O2

int IsCharIdent(char cChar)

{
  if ((byte)(cChar + 0xbfU) < 0x1a || (byte)(cChar - 0x30U) < 10) {
    return 1;
  }
  return (int)(cChar == '_' || (byte)(cChar + 0x9fU) < 0x1a);
}

Assistant:

int IsCharIdent(char cChar)
{
    if ((cChar >= '0' && cChar <= '9') ||
            (cChar >= 'A' && cChar <= 'Z') ||
            (cChar >= 'a' && cChar <= 'z') ||
            cChar == '_')
        return TRUE;
    else
        return FALSE;
}